

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_Model_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/Model.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  CoreMLModels::protobuf_VisionFeaturePrint_2eproto::InitDefaults();
  CoreMLModels::protobuf_TextClassifier_2eproto::InitDefaults();
  CoreMLModels::protobuf_WordTagger_2eproto::InitDefaults();
  CoreMLModels::protobuf_Gazetteer_2eproto::InitDefaults();
  CoreMLModels::protobuf_WordEmbedding_2eproto::InitDefaults();
  protobuf_ArrayFeatureExtractor_2eproto::InitDefaults();
  protobuf_BayesianProbitRegressor_2eproto::InitDefaults();
  protobuf_CategoricalMapping_2eproto::InitDefaults();
  protobuf_CustomModel_2eproto::InitDefaults();
  protobuf_DictVectorizer_2eproto::InitDefaults();
  protobuf_FeatureTypes_2eproto::InitDefaults();
  protobuf_FeatureVectorizer_2eproto::InitDefaults();
  protobuf_GLMRegressor_2eproto::InitDefaults();
  protobuf_GLMClassifier_2eproto::InitDefaults();
  protobuf_NearestNeighbors_2eproto::InitDefaults();
  protobuf_Identity_2eproto::InitDefaults();
  protobuf_Imputer_2eproto::InitDefaults();
  protobuf_NeuralNetwork_2eproto::InitDefaults();
  protobuf_Normalizer_2eproto::InitDefaults();
  protobuf_OneHotEncoder_2eproto::InitDefaults();
  protobuf_Scaler_2eproto::InitDefaults();
  protobuf_NonMaximumSuppression_2eproto::InitDefaults();
  protobuf_SVM_2eproto::InitDefaults();
  protobuf_TreeEnsemble_2eproto::InitDefaults();
  protobuf_Parameters_2eproto::InitDefaults();
  protobuf_ItemSimilarityRecommender_2eproto::InitDefaults();
  CoreMLModels::protobuf_SoundAnalysisPreprocessing_2eproto::InitDefaults();
  protobuf_LinkedModel_2eproto::InitDefaults();
  Pipeline::Pipeline((Pipeline *)&_Pipeline_default_instance_);
  DAT_007220c0 = 1;
  PipelineClassifier::PipelineClassifier
            ((PipelineClassifier *)&_PipelineClassifier_default_instance_);
  DAT_007220e8 = 1;
  PipelineRegressor::PipelineRegressor((PipelineRegressor *)&_PipelineRegressor_default_instance_);
  DAT_00722110 = 1;
  FeatureDescription::FeatureDescription
            ((FeatureDescription *)&_FeatureDescription_default_instance_);
  DAT_00722148 = 1;
  DAT_00722158 = (undefined8 *)0x0;
  _DAT_00722170 = 0;
  _DAT_00722160 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_00722168 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_00722178 = 0;
  _Metadata_UserDefinedEntry_default_instance_ = &PTR__MapEntryImpl_006fdf28;
  DAT_00722180 = 1;
  Metadata::Metadata((Metadata *)&_Metadata_default_instance_);
  DAT_007221e0 = 1;
  ModelDescription::ModelDescription((ModelDescription *)&_ModelDescription_default_instance_);
  DAT_00722260 = 1;
  SerializedModel::SerializedModel((SerializedModel *)&_SerializedModel_default_instance_);
  DAT_00722290 = 1;
  Model::Model((Model *)&_Model_default_instance_);
  DAT_007222c8 = 1;
  DAT_007220d8 = &_Pipeline_default_instance_;
  DAT_00722100 = &_Pipeline_default_instance_;
  DAT_00722138 = &_FeatureType_default_instance_;
  DAT_00722158 = &_Metadata_UserDefinedEntry_default_instance_;
  DAT_00722250 = &_Metadata_default_instance_;
  DAT_007222a8 = &_ModelDescription_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::CoreMLModels::protobuf_VisionFeaturePrint_2eproto::InitDefaults();
  ::CoreML::Specification::CoreMLModels::protobuf_TextClassifier_2eproto::InitDefaults();
  ::CoreML::Specification::CoreMLModels::protobuf_WordTagger_2eproto::InitDefaults();
  ::CoreML::Specification::CoreMLModels::protobuf_Gazetteer_2eproto::InitDefaults();
  ::CoreML::Specification::CoreMLModels::protobuf_WordEmbedding_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_ArrayFeatureExtractor_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_BayesianProbitRegressor_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_CategoricalMapping_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_CustomModel_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_DictVectorizer_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_FeatureTypes_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_FeatureVectorizer_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_GLMRegressor_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_GLMClassifier_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_NearestNeighbors_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_Identity_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_Imputer_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_NeuralNetwork_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_Normalizer_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_OneHotEncoder_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_Scaler_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_NonMaximumSuppression_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_SVM_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_TreeEnsemble_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_Parameters_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_ItemSimilarityRecommender_2eproto::InitDefaults();
  ::CoreML::Specification::CoreMLModels::protobuf_SoundAnalysisPreprocessing_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_LinkedModel_2eproto::InitDefaults();
  _Pipeline_default_instance_.DefaultConstruct();
  _PipelineClassifier_default_instance_.DefaultConstruct();
  _PipelineRegressor_default_instance_.DefaultConstruct();
  _FeatureDescription_default_instance_.DefaultConstruct();
  _Metadata_UserDefinedEntry_default_instance_.DefaultConstruct();
  _Metadata_default_instance_.DefaultConstruct();
  _ModelDescription_default_instance_.DefaultConstruct();
  _SerializedModel_default_instance_.DefaultConstruct();
  _Model_default_instance_.DefaultConstruct();
  _PipelineClassifier_default_instance_.get_mutable()->pipeline_ = const_cast< ::CoreML::Specification::Pipeline*>(
      ::CoreML::Specification::Pipeline::internal_default_instance());
  _PipelineRegressor_default_instance_.get_mutable()->pipeline_ = const_cast< ::CoreML::Specification::Pipeline*>(
      ::CoreML::Specification::Pipeline::internal_default_instance());
  _FeatureDescription_default_instance_.get_mutable()->type_ = const_cast< ::CoreML::Specification::FeatureType*>(
      ::CoreML::Specification::FeatureType::internal_default_instance());
  _Metadata_UserDefinedEntry_default_instance_.get_mutable()->set_default_instance(_Metadata_UserDefinedEntry_default_instance_.get_mutable());
  _Metadata_UserDefinedEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _ModelDescription_default_instance_.get_mutable()->metadata_ = const_cast< ::CoreML::Specification::Metadata*>(
      ::CoreML::Specification::Metadata::internal_default_instance());
  _Model_default_instance_.get_mutable()->description_ = const_cast< ::CoreML::Specification::ModelDescription*>(
      ::CoreML::Specification::ModelDescription::internal_default_instance());
}